

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelloWorld.cpp
# Opt level: O0

void __thiscall HelloWorld::Append(HelloWorld *this,string *add)

{
  ostream *poVar1;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  string *local_18;
  string *add_local;
  HelloWorld *this_local;
  
  local_18 = add;
  add_local = &this->m_Message;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,(string *)this);
  std::operator<<(poVar1,(string *)local_18);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)this,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void HelloWorld::Append(const std::string &add)
{
    std::stringstream ss;
    ss << m_Message << add;
    m_Message = ss.str();
}